

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int glfwUpdateGamepadMappings(char *string)

{
  byte bVar1;
  GLFWbool GVar2;
  byte *__s;
  _GLFWmapping *p_Var3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  _GLFWmapping mapping;
  char line [1024];
  _GLFWmapping local_52d;
  byte local_438 [1032];
  
  if (string == (char *)0x0) {
    __assert_fail("string != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/thirdparty/glfw/src/input.c"
                  ,0x46b,"int glfwUpdateGamepadMappings(const char *)");
  }
  if (_glfw.initialized == 0) {
    iVar6 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    bVar1 = *string;
    if (bVar1 != 0) {
      do {
        if (((byte)(bVar1 - 0x30) < 10) ||
           ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0))))
        {
          __s = (byte *)strcspn(string,"\r\n");
          if (__s < (byte *)0x400) {
            memset(&local_52d,0,0xf5);
            memcpy(local_438,string,(size_t)__s);
            local_438[(long)__s] = 0;
            GVar2 = parseMapping(&local_52d,(char *)local_438);
            if (GVar2 != 0) {
              p_Var3 = findMapping(local_52d.guid);
              if (p_Var3 == (_GLFWmapping *)0x0) {
                lVar4 = (long)_glfw.mappingCount;
                _glfw.mappingCount = (int)(lVar4 + 1);
                _glfw.mappings = (_GLFWmapping *)realloc(_glfw.mappings,(lVar4 + 1) * 0xf5);
                p_Var3 = _glfw.mappings + (long)_glfw.mappingCount + -1;
              }
              memcpy(p_Var3,&local_52d,0xf5);
            }
          }
        }
        else {
          sVar5 = strcspn(string,"\r\n");
          __s = (byte *)string + sVar5;
          string = (char *)strspn((char *)__s,"\r\n");
        }
        string = (char *)((byte *)string + (long)__s);
        bVar1 = *string;
      } while (bVar1 != 0);
    }
    lVar4 = 0;
    do {
      if (*(int *)(_glfw.joysticks[0].name + lVar4 + -0x34) != 0) {
        p_Var3 = findValidMapping((_GLFWjoystick *)(_glfw.joysticks[0].name + lVar4 + -0x34));
        *(_GLFWmapping **)(_glfw.joysticks[0].linjs.path + lVar4 + -0xc) = p_Var3;
      }
      lVar4 = lVar4 + 0x2018;
    } while (lVar4 != 0x20180);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

GLFWAPI int glfwUpdateGamepadMappings(const char* string)
{
    int jid;
    const char* c = string;

    assert(string != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    while (*c)
    {
        if ((*c >= '0' && *c <= '9') ||
            (*c >= 'a' && *c <= 'f') ||
            (*c >= 'A' && *c <= 'F'))
        {
            char line[1024];

            const size_t length = strcspn(c, "\r\n");
            if (length < sizeof(line))
            {
                _GLFWmapping mapping = {{0}};

                memcpy(line, c, length);
                line[length] = '\0';

                if (parseMapping(&mapping, line))
                {
                    _GLFWmapping* previous = findMapping(mapping.guid);
                    if (previous)
                        *previous = mapping;
                    else
                    {
                        _glfw.mappingCount++;
                        _glfw.mappings =
                            realloc(_glfw.mappings,
                                    sizeof(_GLFWmapping) * _glfw.mappingCount);
                        _glfw.mappings[_glfw.mappingCount - 1] = mapping;
                    }
                }
            }

            c += length;
        }
        else
        {
            c += strcspn(c, "\r\n");
            c += strspn(c, "\r\n");
        }
    }

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        _GLFWjoystick* js = _glfw.joysticks + jid;
        if (js->present)
            js->mapping = findValidMapping(js);
    }

    return GLFW_TRUE;
}